

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O2

QRect __thiscall QWidgetItem::geometry(QWidgetItem *this)

{
  QWidget *pQVar1;
  bool bVar2;
  QRect QVar3;
  
  bVar2 = QWidget::testAttribute_helper(this->wid,WA_LayoutUsesWidgetRect);
  pQVar1 = this->wid;
  if (bVar2) {
    QVar3 = pQVar1->data->crect;
  }
  else {
    QVar3 = toLayoutItemRect(*(QWidgetPrivate **)&pQVar1->field_0x8,&pQVar1->data->crect);
  }
  return QVar3;
}

Assistant:

QRect QWidgetItem::geometry() const
{
    return !wid->testAttribute(Qt::WA_LayoutUsesWidgetRect)
           ? toLayoutItemRect(wid->d_func(), wid->geometry())
           : wid->geometry();
}